

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
external_image_data_message_write_read::test_method(external_image_data_message_write_read *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  lazy_ostream *prev;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_158;
  uchar local_131;
  seed local_130 [8];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_char_&>,_unsigned_char_&,_boost::test_tools::assertion::op::EQ<unsigned_char,_unsigned_char,_void>_>
  local_128;
  assertion_result local_118;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  int local_dc;
  undefined1 local_d8 [4];
  int i_1;
  buffer_reader reader;
  external_image_data_message read_msg;
  buffer_writer writer;
  buffer buffer;
  allocator<unsigned_char> local_69;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec;
  uchar local_48 [4];
  int i;
  uchar test [26];
  external_image_data_message write_msg;
  external_image_data_message_write_read *this_local;
  
  external_image_data_message::external_image_data_message
            ((external_image_data_message *)(test + 0x18));
  for (vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x1a;
      vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    local_48[vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_] =
         (char)vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 'A';
  }
  std::allocator<unsigned_char>::allocator(&local_69);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_68,local_48,test + 0x12,
             &local_69);
  std::allocator<unsigned_char>::~allocator(&local_69);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(test + 0x18),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  buffer_writer::buffer_writer
            ((buffer_writer *)
             &read_msg.pixel.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(buffer *)&writer._start);
  ::operator<<((buffer_writer *)
               &read_msg.pixel.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (external_image_data_message *)(test + 0x18));
  external_image_data_message::external_image_data_message
            ((external_image_data_message *)&reader._index);
  buffer_reader::buffer_reader((buffer_reader *)local_d8,(buffer *)&writer._start);
  ::operator>>((buffer_reader *)local_d8,(external_image_data_message *)&reader._index);
  for (local_dc = 0; local_dc < 0x1a; local_dc = local_dc + 1) {
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
      boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_f0,0xdf,&local_100);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reader._index,
                 (long)local_dc);
      boost::test_tools::assertion::seed::operator->*(local_130,&local_131);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(test + 0x18),
                 (long)local_dc);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_char&>,unsigned_char>::
      operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_char&>,unsigned_char>
                  *)&local_128,(uchar *)local_130);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_char_&>,_unsigned_char_&,_boost::test_tools::assertion::op::EQ<unsigned_char,_unsigned_char,_void>_>
      ::evaluate(&local_118,&local_128,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_168,"read_msg.pixel[i] == write_msg.pixel[i]",0x27);
      boost::unit_test::operator<<(&local_158,prev,&local_168);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::test_tools::tt_detail::report_assertion
                (&local_118,&local_158.super_lazy_ostream,&local_178,0xdf,CHECK,
                 CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_158);
      boost::test_tools::assertion_result::~assertion_result(&local_118);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  external_image_data_message::~external_image_data_message
            ((external_image_data_message *)&reader._index);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  external_image_data_message::~external_image_data_message
            ((external_image_data_message *)(test + 0x18));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_image_data_message_write_read)
{
    external_image_data_message write_msg;
    unsigned char test[26]; 
    for(int i = 0; i<26; i++){
      test[i] = 65 + i;
    }
    std::vector<unsigned char> vec(test, test + 26);
    write_msg.pixel = vec;

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_image_data_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<26; i++){
        BOOST_TEST(read_msg.pixel[i] == write_msg.pixel[i]);
    }
}